

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O2

void __thiscall
tf::SmallVectorImpl<tf::Node*>::append<tf::Node**>
          (SmallVectorImpl<tf::Node*> *this,Node **in_start,Node **in_end)

{
  void *__dest;
  ulong __n;
  
  __n = (long)in_end - (long)in_start;
  __dest = *(void **)(this + 8);
  if ((ulong)(*(long *)(this + 0x10) - (long)__dest) < __n) {
    SmallVectorTemplateBase<tf::Node_*,_true>::grow
              ((SmallVectorTemplateBase<tf::Node_*,_true> *)this,
               ((long)__dest - *(long *)this >> 3) + ((long)__n >> 3));
    __dest = *(void **)(this + 8);
  }
  if (in_start != in_end) {
    memcpy(__dest,in_start,__n);
    __dest = *(void **)(this + 8);
  }
  *(ulong *)(this + 8) = (long)__dest + __n;
  return;
}

Assistant:

void append(in_iter in_start, in_iter in_end) {
    size_type NumInputs = std::distance(in_start, in_end);
    // Grow allocated space if needed.
    if (NumInputs > size_type(this->capacity_ptr()-this->end()))
      this->grow(this->size()+NumInputs);

    // Copy the new elements over.
    this->uninitialized_copy(in_start, in_end, this->end());
    this->setEnd(this->end() + NumInputs);
  }